

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_print.h
# Opt level: O1

void Color::print_error(string *out)

{
  ostream *poVar1;
  Modifier reset;
  Modifier bold;
  Modifier red;
  Modifier local_24;
  Modifier local_20;
  Modifier local_1c;
  
  local_1c.code = FG_RED;
  local_20.code = BOLD;
  local_24.code = RESET;
  poVar1 = operator<<((ostream *)&std::cout,&local_1c);
  poVar1 = operator<<(poVar1,&local_20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[ ERROR      ] ",0xf);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(out->_M_dataplus)._M_p,out->_M_string_length);
  poVar1 = operator<<(poVar1,&local_24);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

inline void print_error(const std::string &out) {
  Color::Modifier red(Color::FG_RED);
  Color::Modifier bold(Color::BOLD);
  Color::Modifier reset(Color::RESET);
  std::cout << red << bold << "[ ERROR      ] "
            << out << reset << std::endl;
}